

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::emplaceRealloc<slang::ast::LValue::BitSlice>
          (SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
           *this,pointer pos,BitSlice *args)

{
  ulong uVar1;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var2;
  size_type sVar3;
  _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *p_Var4;
  EVP_PKEY_CTX *ctx;
  EVP_PKEY_CTX *pEVar5;
  EVP_PKEY_CTX *__rhs;
  long lVar6;
  
  if (this->len == 0x1745d1745d1745d) {
    detail::throwLengthError();
  }
  pEVar5 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar5 < ctx) {
    pEVar5 = ctx;
  }
  if (0x1745d1745d1745d - uVar1 < uVar1) {
    pEVar5 = (EVP_PKEY_CTX *)0x1745d1745d1745d;
  }
  lVar6 = (long)pos - (long)this->data_;
  p_Var2 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
            *)operator_new((long)pEVar5 * 0x58);
  *(ConstantRange *)((long)p_Var2 + lVar6) = args->range;
  *(undefined1 *)((long)p_Var2 + lVar6 + 0x50) = 0;
  __rhs = (EVP_PKEY_CTX *)this->data_;
  sVar3 = this->len;
  if (__rhs + sVar3 * 0x58 == (EVP_PKEY_CTX *)pos) {
    p_Var4 = p_Var2;
    if (sVar3 != 0) {
      do {
        ctx = __rhs;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs);
        __rhs = __rhs + 0x58;
        p_Var4 = p_Var4 + 1;
      } while (__rhs != (EVP_PKEY_CTX *)pos);
    }
  }
  else {
    p_Var4 = p_Var2;
    if (__rhs != (EVP_PKEY_CTX *)pos) {
      do {
        ctx = __rhs;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)__rhs);
        __rhs = __rhs + 0x58;
        p_Var4 = p_Var4 + 1;
      } while (__rhs != (EVP_PKEY_CTX *)pos);
      __rhs = (EVP_PKEY_CTX *)this->data_;
      sVar3 = this->len;
    }
    if (__rhs + sVar3 * 0x58 != (EVP_PKEY_CTX *)pos) {
      p_Var4 = (_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                *)(lVar6 + (long)p_Var2);
      do {
        p_Var4 = p_Var4 + 1;
        ctx = (EVP_PKEY_CTX *)pos;
        std::__detail::__variant::
        _Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
        ::_Move_ctor_base(p_Var4,(_Move_ctor_base<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
                                  *)pos);
        pos = (pointer)((long)pos + 0x58);
      } while ((EVP_PKEY_CTX *)pos != __rhs + sVar3 * 0x58);
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar5;
  this->data_ = (pointer)p_Var2;
  return (pointer)((long)p_Var2 + lVar6);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}